

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O2

float Tim_ManGetCoRequired(Tim_Man_t *p,int iCo)

{
  Vec_Ptr_t *p_00;
  Tim_Obj_t *pTVar1;
  Tim_Obj_t *pTVar2;
  Tim_Box_t *pBox;
  float *pfVar3;
  Tim_Obj_t *pTVar4;
  uint i;
  long lVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  float local_3c;
  
  pTVar1 = Tim_ManCo(p,iCo);
  if (p->fUseTravId == 0) {
    iVar6 = p->nTravIds;
  }
  else {
    iVar6 = p->nTravIds;
    if (pTVar1->TravId == iVar6) goto LAB_003e0fba;
  }
  pTVar1->TravId = iVar6;
  pTVar2 = Tim_ManCo(p,iCo);
  if (-1 < pTVar2->iObj2Box) {
    p_00 = p->vBoxes;
    pTVar2 = Tim_ManCo(p,iCo);
    pBox = (Tim_Box_t *)Vec_PtrEntry(p_00,pTVar2->iObj2Box);
    if (pBox != (Tim_Box_t *)0x0) {
      pBox->TravId = p->nTravIds;
      if (p->fUseTravId != 0) {
        i = 0;
        while (((int)i < pBox->nOutputs &&
               (pTVar2 = Tim_ManBoxOutput(p,pBox,i), pTVar2 != (Tim_Obj_t *)0x0))) {
          if (pTVar2->TravId != p->nTravIds) {
            printf("Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n"
                   ,(ulong)i,(ulong)(uint)pBox->iBox);
          }
          i = i + 1;
        }
      }
      pfVar3 = Tim_ManBoxDelayTable(p,pBox->iBox);
      lVar5 = 0;
      while ((lVar5 < pBox->nInputs &&
             (pTVar2 = Tim_ManBoxInput(p,pBox,(int)lVar5), pTVar2 != (Tim_Obj_t *)0x0))) {
        local_3c = 1e+09;
        for (lVar7 = 0; lVar7 < pBox->nOutputs; lVar7 = lVar7 + 1) {
          iVar6 = (int)lVar7;
          pTVar4 = Tim_ManBoxOutput(p,pBox,iVar6);
          if (pTVar4 == (Tim_Obj_t *)0x0) break;
          if (((pfVar3[(long)(pBox->nInputs * iVar6) + lVar7 + 3] != -1e+09) ||
              (NAN(pfVar3[(long)(pBox->nInputs * iVar6) + lVar7 + 3]))) &&
             (fVar8 = pTVar4->timeReq - pfVar3[(long)(pBox->nInputs * iVar6) + lVar5 + 3],
             fVar8 <= local_3c)) {
            local_3c = fVar8;
          }
        }
        pTVar2->timeReq = local_3c;
        pTVar2->TravId = p->nTravIds;
        lVar5 = lVar5 + 1;
      }
    }
  }
LAB_003e0fba:
  return pTVar1->timeReq;
}

Assistant:

float Tim_ManGetCoRequired( Tim_Man_t * p, int iCo )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObjThis, * pObj, * pObjRes;
    float * pTable, * pDelays, DelayBest;
    int i, k;
    // consider the already processed PO
    pObjThis = Tim_ManCo( p, iCo );
    if ( p->fUseTravId && pObjThis->TravId == p->nTravIds )
        return pObjThis->timeReq;
    pObjThis->TravId = p->nTravIds;
    // consider the main PO
    pBox = Tim_ManCoBox( p, iCo );
    if ( pBox == NULL )
        return pObjThis->timeReq;
    // update box timing
    pBox->TravId = p->nTravIds;
    // get the required times of the outputs of the box (PIs)
    if ( p->fUseTravId )
    Tim_ManBoxForEachOutput( p, pBox, pObj, i )
        if ( pObj->TravId != p->nTravIds )
            printf( "Tim_ManGetCoRequired(): Output required times of output %d the box %d are not up to date!\n", i, pBox->iBox );
    // compute the required times for each input of the box (POs)
    pTable = Tim_ManBoxDelayTable( p, pBox->iBox );
    Tim_ManBoxForEachInput( p, pBox, pObjRes, i )
    {
        DelayBest = TIM_ETERNITY;
        Tim_ManBoxForEachOutput( p, pBox, pObj, k )
        {
            pDelays = pTable + 3 + k * pBox->nInputs;
            if ( pDelays[k] != -ABC_INFINITY )
                DelayBest = Abc_MinFloat( DelayBest, pObj->timeReq - pDelays[i] );
        }
        pObjRes->timeReq = DelayBest;
        pObjRes->TravId = p->nTravIds;
    }
    return pObjThis->timeReq;
}